

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O0

ostream * test_detail::print_tuple_impl<std::tuple<char_const&,char_const&>,0ul,1ul>
                    (ostream *stream,size_type t)

{
  char *pcVar1;
  ostream *poVar2;
  undefined4 local_34;
  undefined4 *local_30;
  initializer_list<int> x;
  tuple<const_char_&,_const_char_&> *t_local;
  ostream *stream_local;
  
  x._M_len = t;
  std::operator<<(stream,"(");
  pcVar1 = std::get<0ul,char_const&,char_const&>((tuple<const_char_&,_const_char_&> *)x._M_len);
  std::operator<<(stream,*pcVar1);
  poVar2 = std::operator<<(stream,", ");
  pcVar1 = std::get<1ul,char_const&,char_const&>((tuple<const_char_&,_const_char_&> *)x._M_len);
  std::operator<<(poVar2,*pcVar1);
  local_34 = 0;
  local_30 = &local_34;
  x._M_array = (iterator)0x1;
  std::operator<<(stream,")");
  return stream;
}

Assistant:

std::ostream & print_tuple_impl (std::ostream & stream, const Tuple & t, std::index_sequence<Head, Tail...>)
    {
        stream << "(";
        stream << std::get<Head>(t);
        auto x = {(stream << ", " << std::get<Tail>(t), 0)...};
        static_cast<void>(x);
        stream << ")";

        return stream;
    }